

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccmdutl.cpp
# Opt level: O1

int CTcCommandUtil::parse_opt_file(osfildef *fp,char **argv,CTcOptFileHelper *helper)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  _func_int **pp_Var8;
  char *pcVar9;
  undefined4 extraout_var_01;
  undefined8 uVar10;
  char *pcVar11;
  size_t sVar12;
  char *pcVar13;
  char *pcVar14;
  int iVar15;
  CTcOptFileHelperDefault default_helper;
  char config_id [128];
  size_t local_f0;
  CTcOptFileHelper local_c0;
  char local_b8 [136];
  undefined4 extraout_var_00;
  
  local_c0._vptr_CTcOptFileHelper = (_func_int **)&PTR_alloc_opt_file_str_00312f68;
  if (helper == (CTcOptFileHelper *)0x0) {
    helper = &local_c0;
  }
  local_f0 = 0x200;
  iVar3 = (**helper->_vptr_CTcOptFileHelper)(helper,0x200);
  local_b8[0] = '\0';
  iVar15 = 0;
  pcVar13 = (char *)CONCAT44(extraout_var,iVar3);
LAB_001f8583:
  pcVar4 = fgets(pcVar13,(int)local_f0,(FILE *)fp);
  pcVar6 = pcVar13;
  if (pcVar4 != (char *)0x0) {
    do {
      sVar12 = local_f0 + 0x200;
      sVar5 = strlen(pcVar13);
      pcVar6 = pcVar13;
      if ((sVar5 != 0) && ((pcVar13[sVar5 - 1] == '\r' || (pcVar13[sVar5 - 1] == '\n'))))
      goto LAB_001f864a;
      if (local_f0 - 1 != sVar5) break;
      iVar3 = (**helper->_vptr_CTcOptFileHelper)(helper,sVar12);
      pcVar6 = (char *)CONCAT44(extraout_var_00,iVar3);
      memcpy(pcVar6,pcVar13,local_f0);
      (*helper->_vptr_CTcOptFileHelper[1])(helper,pcVar13);
      pcVar7 = fgets(pcVar6 + sVar5,(int)sVar12 - (int)sVar5,(FILE *)fp);
      pcVar13 = pcVar6;
      local_f0 = sVar12;
    } while (pcVar7 != (char *)0x0);
    goto LAB_001f8667;
  }
  goto LAB_001f8738;
  while (sVar5 = sVar5 - 1, sVar5 != 0) {
LAB_001f864a:
    if ((pcVar13[sVar5 - 1] != '\r') && (pcVar13[sVar5 - 1] != '\n')) goto LAB_001f8662;
  }
  sVar5 = 0;
LAB_001f8662:
  pcVar13[sVar5] = '\0';
LAB_001f8667:
  pcVar13 = pcVar6 + -1;
  do {
    pcVar7 = pcVar13;
    pcVar13 = pcVar7 + 1;
    iVar3 = isspace((int)pcVar7[1]);
  } while (iVar3 != 0);
  sVar5 = strlen(pcVar13);
  if ((sVar5 < 9) || (iVar3 = memicmp(pcVar13,"[config:",8), iVar3 != 0)) {
    if (local_b8[0] == '\0') {
      if ((*pcVar13 == '#') || (*pcVar13 == '\0')) {
        (*helper->_vptr_CTcOptFileHelper[2])(helper,pcVar6);
      }
      else {
        (*helper->_vptr_CTcOptFileHelper[3])(helper,pcVar6);
        pcVar13 = pcVar6;
        do {
          if (*pcVar13 == '\0') break;
          do {
            pcVar7 = pcVar13;
            cVar1 = *pcVar7;
            iVar3 = isspace((int)cVar1);
            pcVar14 = pcVar7 + 1;
            pcVar13 = pcVar14;
          } while (iVar3 != 0);
          pcVar9 = pcVar14;
          pcVar11 = pcVar14;
          if (cVar1 == '\"') {
            do {
              pcVar7 = pcVar14;
              if (*pcVar9 == '\"') {
                pcVar13 = pcVar9 + 1;
                if (pcVar9[1] != '\"') goto LAB_001f8806;
              }
              else {
                pcVar13 = pcVar9;
                if (*pcVar9 == '\0') goto LAB_001f8806;
              }
              *pcVar11 = *pcVar13;
              pcVar9 = pcVar13 + 1;
              pcVar11 = pcVar11 + 1;
            } while( true );
          }
          if (cVar1 == '\0') {
            bVar2 = false;
            pcVar13 = pcVar7;
          }
          else {
            cVar1 = *pcVar7;
            pcVar11 = pcVar7;
            while ((pcVar13 = pcVar11, cVar1 != '\0' && (iVar3 = isspace((int)cVar1), iVar3 == 0)))
            {
              cVar1 = pcVar11[1];
              pcVar11 = pcVar11 + 1;
            }
LAB_001f8806:
            if (argv != (char **)0x0) {
              sVar5 = (long)pcVar11 - (long)pcVar7;
              iVar3 = (**helper->_vptr_CTcOptFileHelper)(helper,sVar5 + 1);
              argv[iVar15] = (char *)CONCAT44(extraout_var_01,iVar3);
              memcpy((char *)CONCAT44(extraout_var_01,iVar3),pcVar7,sVar5);
              argv[iVar15][sVar5] = '\0';
            }
            iVar15 = iVar15 + 1;
            bVar2 = true;
          }
        } while (bVar2);
      }
      goto LAB_001f8738;
    }
    pp_Var8 = helper->_vptr_CTcOptFileHelper;
    uVar10 = 0;
  }
  else {
    sVar5 = 0;
    for (pcVar13 = pcVar7 + 9; (*pcVar13 != '\0' && (*pcVar13 != ']')); pcVar13 = pcVar13 + 1) {
      sVar5 = sVar5 + 1;
    }
    if (0x7e < sVar5) {
      sVar5 = 0x7f;
    }
    memcpy(local_b8,pcVar7 + 9,sVar5);
    local_b8[sVar5] = '\0';
    pp_Var8 = helper->_vptr_CTcOptFileHelper;
    uVar10 = 1;
  }
  (*pp_Var8[4])(helper,local_b8,pcVar6,uVar10);
LAB_001f8738:
  pcVar13 = pcVar6;
  if (pcVar4 == (char *)0x0) {
    (*helper->_vptr_CTcOptFileHelper[1])(helper,pcVar6);
    return iVar15;
  }
  goto LAB_001f8583;
}

Assistant:

int CTcCommandUtil::parse_opt_file(osfildef *fp, char **argv,
                                   CTcOptFileHelper *helper)
{
    char *buf;
    char config_id[128];
    size_t buflen;
    int argc;
    CTcOptFileHelperDefault default_helper;

    /* if they didn't give us a helper object, use our default */
    if (helper == 0)
        helper = &default_helper;

    /* allocate our initial buffer */
    buflen = 512;
    buf = helper->alloc_opt_file_str(buflen);

    /* we're not in a configuration section yet */
    config_id[0] = '\0';

    /* keep going until we run out of text in the file */
    for (argc = 0 ; ; )
    {
        size_t len;
        char *p;

        /* read the next line - stop if we're done */
        if (osfgets(buf, buflen, fp) == 0)
            break;

        /* check for proper termination */
        for (;;)
        {
            /* get the buffer length */
            len = strlen(buf);

            /* check for a newline of some kind at the end */
            if (len != 0 && (buf[len - 1] == '\n' || buf[len - 1] == '\r'))
            {
                /* 
                 *   remove consecutive newline/return characters - in case
                 *   we are using a file moved from another system with
                 *   incompatible newline conventions, simply remove all of
                 *   the newlines we find 
                 */
                while (len != 0
                       && (buf[len-1] == '\n' || buf[len - 1] == '\r'))
                    --len;

                /* null-terminate the line */
                buf[len] = '\0';

                /* we now have our line */
                break;
            }
            else if (len == buflen - 1)
            {
                char *new_buf;
                size_t new_buf_len;
                
                /* 
                 *   The buffer was completely filled, and wasn't
                 *   null-terminated - the line must be too long for the
                 *   buffer.  Expand the buffer and go back for more.  
                 */
                new_buf_len = buflen + 512;
                new_buf = helper->alloc_opt_file_str(new_buf_len);

                /* copy the old buffer into the new buffer */
                memcpy(new_buf, buf, buflen);

                /* discard the old buffer */
                helper->free_opt_file_str(buf);

                /* switch to the new buffer */
                buf = new_buf;
                buflen = new_buf_len;

                /* append more data into the line buffer and try again */
                if (osfgets(buf + len, buflen - len, fp) == 0)
                    break;
            }
            else
            {
                /* 
                 *   The buffer wasn't completely full, and we didn't find a
                 *   newline.  This must mean that we've reached the end of
                 *   the file, so we've read as much as we can for this
                 *   line.  
                 */
                break;
            }
        }

        /* skip leading spaces */
        for (p = buf ; isspace(*p) ; ++p) ;

        /*
         *   Check to see if we're entering a new configuration section.  If
         *   the line matches the pattern "[Config:xxx]", then we're starting
         *   a new configuration section with identifier "xxx". 
         */
        if (strlen(p) > 8 && memicmp(p, "[config:", 8) == 0)
        {
            char *start;
            size_t copy_len;
            
            /* 
             *   note the part after the colon and up to the closing bracket
             *   - it's the ID of this configuration section 
             */
            for (p += 8, start = p ; *p != ']' && *p != '\0' ; ++p) ;

            /* limit the ID size to our buffer maximum */
            copy_len = p - start;
            if (copy_len > sizeof(config_id) - 1)
                copy_len = sizeof(config_id) - 1;

            /* copy and null-terminate the ID string */
            memcpy(config_id, start, copy_len);
            config_id[copy_len] = '\0';

            /* process the configuration ID line itself as a config line */
            helper->process_config_line(config_id, buf, TRUE);

            /* we're done processing this line */
            continue;
        }

        /* 
         *   if we're in a configuration section, simply process the line
         *   through the helper as a configuration line - this doesn't
         *   contain any options we can parse, since configuration sections
         *   are private to their respective definers 
         */
        if (config_id[0] != '\0')
        {
            /* process the configuration line through the helper */
            helper->process_config_line(config_id, buf, FALSE);

            /* we're done with this line */
            continue;
        }
        
        /* 
         *   If we've reached the end of the line or a command character
         *   ('#'), we're done with this line.  Note that we check for
         *   comments AFTER checking to see if we're in a config section,
         *   because we want to send any comment lines within a config
         *   section to the helper for processing as part of the config -
         *   even comments are opaque to us within a config section.  
         */
        if (*p == '\0' || *p == '#')
        {
            /* tell the helper about the comment */
            helper->process_comment_line(buf);

            /* we're done with the line - go back for the next one */
            continue;
        }

        /* tell the helper about the non-comment line */
        helper->process_non_comment_line(buf);

        /* parse the options on this line */
        for (p = buf ; *p != '\0' ; )
        {
            char *start;
            size_t arg_len;

            /* skip leading spaces */
            for ( ; isspace(*p) ; ++p) ;

            /* check to see if we reached the end of the line */
            if (*p == '\0')
                break;

            /* 
             *   if the argument is quoted, find the matching quote;
             *   otherwise, look for the next space 
             */
            if (*p == '"')
            {
                char *dst;

                /* find the matching quote */
                for (++p, start = dst = p ; *p != '\0' ; ++p)
                {
                    /* 
                     *   if this is a quote, check for stuttering - if it's
                     *   stuttered, treat it as a single quote (and convert
                     *   it to same), otherwise we've reached the end of the
                     *   argument 
                     */
                    if (*p == '"')
                    {
                        /* check for stuttering */
                        if (*(p+1) == '"')
                        {
                            /* 
                             *   it's stuttered - skip the extra quote, so
                             *   that we copy only a single quote 
                             */
                            ++p;
                        }
                        else
                        {
                            /* this is our closing quote - skip it */
                            ++p;

                            /* we're done with the argument */
                            break;
                        }
                    }

                    /* copy this character to the output */
                    *dst++ = *p;
                }

                /* note the length of the argument */
                arg_len = dst - start;
            }
            else
            {
                /* find the next space */
                for (start = p ; *p != '\0' && !isspace(*p) ; ++p) ;

                /* note the length of the argument */
                arg_len = p - start;
            }

            /* store the argument if we have an output vector */
            if (argv != 0)
            {
                /* allocate the argument */
                argv[argc] = helper->alloc_opt_file_str(arg_len + 1);

                /* copy it into the result */
                memcpy(argv[argc], start, arg_len);
                argv[argc][arg_len] = '\0';
            }

            /* count the argument */
            ++argc;
        }
    }

    /* done with our line buffer - delete it */
    helper->free_opt_file_str(buf);

    /* return the argument count */
    return argc;
}